

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrFreeNtk(Vec_Ptr_t *vNtk)

{
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *pVVar2;
  Vec_Flt_t *pVVar3;
  
  pVVar1 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Vec_PtrFree(pVVar1);
  pVVar1 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Vec_PtrFree(pVVar1);
  pVVar2 = (Vec_Vec_t *)Vec_PtrEntry(vNtk,3);
  Vec_VecFree(pVVar2);
  pVVar2 = (Vec_Vec_t *)Vec_PtrEntry(vNtk,4);
  Vec_VecFree(pVVar2);
  if (5 < vNtk->nSize) {
    pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vNtk,5);
    Vec_FltFree(pVVar3);
    if (6 < vNtk->nSize) {
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vNtk,6);
      Vec_FltFree(pVVar3);
    }
  }
  Vec_PtrFree(vNtk);
  return;
}

Assistant:

void Bac_PtrFreeNtk( Vec_Ptr_t * vNtk )
{
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 3) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 4) );
    if ( Vec_PtrSize(vNtk) > 5 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 5) );
    if ( Vec_PtrSize(vNtk) > 6 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 6) );
    Vec_PtrFree( vNtk );
}